

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynNew * ParseNew(ParseContext *ctx)

{
  LexemeType LVar1;
  Lexeme *begin;
  int iVar2;
  SynBase *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynBase *pSVar3;
  undefined4 extraout_var_01;
  SynNew *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SynBase *pSVar4;
  SynNew *unaff_R12;
  SynBase *pSVar5;
  bool bVar6;
  IntrusiveList<SynBase> IVar7;
  IntrusiveList<SynCallArgument> local_40;
  undefined4 extraout_var_02;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_new) {
    ctx->currentLexeme = begin + 1;
    LVar1 = begin[1].type;
    if (LVar1 == lex_oparen) {
      ctx->currentLexeme = begin + 2;
      this = ParseType(ctx,(bool *)0x0,false);
      if (this == (SynBase *)0x0) {
        anon_unknown.dwarf_16d1cf::Report
                  (ctx,ctx->currentLexeme,"ERROR: type name expected after \'new\'");
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
        this = (SynBase *)CONCAT44(extraout_var,iVar2);
        SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
        this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
      }
      anon_unknown.dwarf_16d1cf::CheckConsume
                (ctx,lex_cparen,"ERROR: matching \')\' not found after \'(\'");
    }
    else {
      this = ParseType(ctx,(bool *)0x0,true);
      if (this == (SynBase *)0x0) {
        anon_unknown.dwarf_16d1cf::Report
                  (ctx,ctx->currentLexeme,"ERROR: type name expected after \'new\'");
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
        this = (SynBase *)CONCAT44(extraout_var_00,iVar2);
        SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
        this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
      }
    }
    if (ctx->currentLexeme->type == lex_obracket) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      pSVar3 = ParseTernaryExpr(ctx);
      if (pSVar3 == (SynBase *)0x0) {
        anon_unknown.dwarf_16d1cf::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after \'[\'");
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
        pSVar3 = (SynBase *)CONCAT44(extraout_var_01,iVar2);
        SynBase::SynBase(pSVar3,0,ctx->currentLexeme,ctx->currentLexeme);
        pSVar3->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
      }
      anon_unknown.dwarf_16d1cf::CheckConsume
                (ctx,lex_cbracket,"ERROR: \']\' not found after expression");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x70);
      this_00 = (SynNew *)CONCAT44(extraout_var_02,iVar2);
      if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_0022148e:
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      SynBase::SynBase((SynBase *)this_00,0x20,begin,ctx->currentLexeme + -1);
      (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f78c0;
      this_00->type = this;
      (this_00->arguments).head = (SynCallArgument *)0x0;
      (this_00->arguments).tail = (SynCallArgument *)0x0;
      this_00->count = pSVar3;
      (this_00->constructor).head = (SynBase *)0x0;
      (this_00->constructor).tail = (SynBase *)0x0;
    }
    else {
      if (((LVar1 != lex_oparen) && (this != (SynBase *)0x0)) && (this->typeID == 9)) {
        pSVar3 = *(SynBase **)&this[1].typeID;
        pSVar4 = (SynBase *)0x0;
        do {
          pSVar5 = pSVar4;
          pSVar4 = pSVar3;
          pSVar3 = pSVar4->next;
        } while (pSVar4->next != (SynBase *)0x0);
        if (pSVar4 == (SynBase *)0x0) {
          bVar6 = false;
        }
        else {
          bVar6 = pSVar4->typeID == 3;
        }
        if (!bVar6) {
          if (pSVar5 == (SynBase *)0x0) {
            this = (SynBase *)this[1]._vptr_SynBase;
          }
          else {
            pSVar5->next = (SynBase *)0x0;
          }
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x70);
          unaff_R12 = (SynNew *)CONCAT44(extraout_var_03,iVar2);
          if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0022148e;
          SynBase::SynBase((SynBase *)unaff_R12,0x20,begin,ctx->currentLexeme + -1);
          (unaff_R12->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f78c0;
          unaff_R12->type = this;
          (unaff_R12->arguments).head = (SynCallArgument *)0x0;
          (unaff_R12->arguments).tail = (SynCallArgument *)0x0;
          unaff_R12->count = pSVar4;
          (unaff_R12->constructor).head = (SynBase *)0x0;
          (unaff_R12->constructor).tail = (SynBase *)0x0;
        }
        if (!bVar6) {
          return unaff_R12;
        }
      }
      if (ctx->currentLexeme->type == lex_oparen) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        local_40 = ParseCallArguments(ctx);
        anon_unknown.dwarf_16d1cf::CheckConsume
                  (ctx,lex_cparen,"ERROR: \')\' not found after function argument list");
      }
      else {
        local_40 = (IntrusiveList<SynCallArgument>)ZEXT816(0);
      }
      if (ctx->currentLexeme->type == lex_ofigure) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        IVar7 = ParseExpressions(ctx);
        anon_unknown.dwarf_16d1cf::CheckConsume
                  (ctx,lex_cfigure,"ERROR: \'}\' not found after custom constructor body");
      }
      else {
        IVar7 = (IntrusiveList<SynBase>)ZEXT816(0);
      }
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x70);
      this_00 = (SynNew *)CONCAT44(extraout_var_04,iVar2);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0022148e;
      SynBase::SynBase((SynBase *)this_00,0x20,begin,ctx->currentLexeme + -1);
      (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f78c0;
      this_00->type = this;
      (this_00->arguments).head = local_40.head;
      (this_00->arguments).tail = local_40.tail;
      this_00->count = (SynBase *)0x0;
      this_00->constructor = IVar7;
    }
  }
  else {
    this_00 = (SynNew *)0x0;
  }
  return this_00;
}

Assistant:

SynNew* ParseNew(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_new))
	{
		SynBase *type = NULL;

		bool explicitType = ctx.Consume(lex_oparen);

		if(explicitType)
		{
			type = ParseType(ctx);

			if(!type)
			{
				Report(ctx, ctx.Current(), "ERROR: type name expected after 'new'");

				type = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			CheckConsume(ctx, lex_cparen, "ERROR: matching ')' not found after '('");
		}
		else
		{
			type = ParseType(ctx, NULL, true);

			if(!type)
			{
				Report(ctx, ctx.Current(), "ERROR: type name expected after 'new'");

				type = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		IntrusiveList<SynCallArgument> arguments;

		IntrusiveList<SynBase> constructor;

		if(ctx.Consume(lex_obracket))
		{
			SynBase *count = ParseTernaryExpr(ctx);

			if(!count)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '['");

				count = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			CheckConsume(ctx, lex_cbracket, "ERROR: ']' not found after expression");

			return new (ctx.get<SynNew>()) SynNew(start, ctx.Previous(), type, arguments, count, constructor);
		}
		else if(!explicitType && isType<SynTypeArray>(type))
		{
			SynTypeArray *arrayType = getType<SynTypeArray>(type);

			// Try to extract last array type extent as a size
			SynBase *prevSize = NULL;
			SynBase *count = arrayType->sizes.head;

			while(count->next)
			{
				prevSize = count;
				count = count->next;
			}

			// Check if the extent is real
			if(!isType<SynNothing>(count))
			{
				if(prevSize)
					prevSize->next = NULL;
				else
					type = arrayType->type;

				return new (ctx.get<SynNew>()) SynNew(start, ctx.Previous(), type, arguments, count, constructor);
			}
		}

		if(ctx.Consume(lex_oparen))
		{
			arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function argument list");
		}

		if(ctx.Consume(lex_ofigure))
		{
			constructor = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after custom constructor body");
		}

		return new (ctx.get<SynNew>()) SynNew(start, ctx.Previous(), type, arguments, NULL, constructor);
	}

	return NULL;
}